

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sprite.cpp
# Opt level: O1

void __thiscall sf::Sprite::setTexture(Sprite *this,Texture *texture,bool resetRect)

{
  Vector2u VVar1;
  Vector2u VVar2;
  undefined3 in_register_00000011;
  IntRect local_28;
  
  if ((CONCAT31(in_register_00000011,resetRect) != 0) ||
     ((((this->m_texture == (Texture *)0x0 && ((this->m_textureRect).left == 0)) &&
       ((this->m_textureRect).width == 0)) &&
      (((this->m_textureRect).top == 0 && ((this->m_textureRect).height == 0)))))) {
    VVar1 = Texture::getSize(texture);
    VVar2 = Texture::getSize(texture);
    local_28.left = 0;
    local_28.top = 0;
    local_28.width = VVar1.x;
    local_28.height = VVar2.y;
    setTextureRect(this,&local_28);
  }
  this->m_texture = texture;
  return;
}

Assistant:

void Sprite::setTexture(const Texture& texture, bool resetRect)
{
    // Recompute the texture area if requested, or if there was no valid texture & rect before
    if (resetRect || (!m_texture && (m_textureRect == sf::IntRect())))
        setTextureRect(IntRect(0, 0, texture.getSize().x, texture.getSize().y));

    // Assign the new texture
    m_texture = &texture;
}